

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFFillTile(TIFF *tif,uint32_t tile)

{
  uint8_t *puVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  tmsize_t tVar5;
  tmsize_t bytecountm;
  uint64_t newbytecount;
  tmsize_t stripsize;
  uint64_t bytecount;
  TIFFDirectory *td;
  uint32_t tile_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20000) == 0) {
    uVar3 = TIFFGetStrileByteCount(tif,tile);
    if ((uVar3 == 0) || (0x7fffffffffffffff < uVar3)) {
      TIFFErrorExtR(tif,"TIFFFillTile","%lu: Invalid tile byte count, tile %u",uVar3,(ulong)tile);
      return 0;
    }
    stripsize = uVar3;
    if (((0x100000 < uVar3) && (uVar4 = TIFFTileSize(tif), uVar4 != 0)) &&
       (uVar4 < (uVar3 - 0x1000) / 10)) {
      stripsize = uVar4 * 10 + 0x1000;
      TIFFErrorExtR(tif,"TIFFFillTile","Too large tile byte count %lu, tile %u. Limiting to %lu",
                    uVar3,(ulong)tile,stripsize);
    }
    if (((tif->tif_flags & 0x800) != 0) &&
       (((ulong)tif->tif_size < (ulong)stripsize ||
        (uVar3 = TIFFGetStrileOffset(tif,tile), (ulong)(tif->tif_size - stripsize) < uVar3)))) {
      tif->tif_curtile = 0xffffffff;
      return 0;
    }
    if (((tif->tif_flags & 0x800) == 0) ||
       (((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0 &&
        ((tif->tif_flags & 0x100) == 0)))) {
      if ((tif->tif_rawdatasize < stripsize) &&
         (tif->tif_curtile = 0xffffffff, (tif->tif_flags & 0x200) == 0)) {
        TIFFErrorExtR(tif,"TIFFFillTile","Data buffer too small to hold tile %u",(ulong)tile);
        return 0;
      }
      if ((tif->tif_flags & 0x800000) != 0) {
        tif->tif_curtile = 0xffffffff;
        tif->tif_rawdata = (uint8_t *)0x0;
        tif->tif_rawdatasize = 0;
        tif->tif_flags = tif->tif_flags & 0xff7fffff;
      }
      if ((tif->tif_flags & 0x800) == 0) {
        tVar5 = TIFFReadRawStripOrTile2(tif,tile,0,stripsize,"TIFFFillTile");
        if (tVar5 != stripsize) {
          return 0;
        }
      }
      else {
        if ((tif->tif_rawdatasize < stripsize) &&
           (iVar2 = TIFFReadBufferSetup(tif,(void *)0x0,stripsize), iVar2 == 0)) {
          return 0;
        }
        tVar5 = TIFFReadRawTile1(tif,tile,tif->tif_rawdata,stripsize,"TIFFFillTile");
        if (tVar5 != stripsize) {
          return 0;
        }
      }
      tif->tif_rawdataoff = 0;
      tif->tif_rawdataloaded = stripsize;
      if (((tif->tif_rawdata != (uint8_t *)0x0) &&
          ((tif->tif_flags & (uint)(tif->tif_dir).td_fillorder) == 0)) &&
         ((tif->tif_flags & 0x100) == 0)) {
        TIFFReverseBits(tif->tif_rawdata,tif->tif_rawdataloaded);
      }
    }
    else {
      if (((tif->tif_flags & 0x200) != 0) && (tif->tif_rawdata != (uint8_t *)0x0)) {
        _TIFFfreeExt(tif,tif->tif_rawdata);
        tif->tif_rawdata = (uint8_t *)0x0;
        tif->tif_rawdatasize = 0;
      }
      tif->tif_flags = tif->tif_flags & 0xfffffdff;
      tif->tif_rawdatasize = stripsize;
      puVar1 = tif->tif_base;
      uVar3 = TIFFGetStrileOffset(tif,tile);
      tif->tif_rawdata = puVar1 + uVar3;
      tif->tif_rawdataoff = 0;
      tif->tif_rawdataloaded = stripsize;
      tif->tif_flags = tif->tif_flags | 0x800000;
    }
  }
  iVar2 = TIFFStartTile(tif,tile);
  return iVar2;
}

Assistant:

int TIFFFillTile(TIFF *tif, uint32_t tile)
{
    static const char module[] = "TIFFFillTile";
    TIFFDirectory *td = &tif->tif_dir;

    if ((tif->tif_flags & TIFF_NOREADRAW) == 0)
    {
        uint64_t bytecount = TIFFGetStrileByteCount(tif, tile);
        if (bytecount == 0 || bytecount > (uint64_t)TIFF_INT64_MAX)
        {
            TIFFErrorExtR(tif, module,
                          "%" PRIu64 ": Invalid tile byte count, tile %" PRIu32,
                          bytecount, tile);
            return (0);
        }

        /* To avoid excessive memory allocations: */
        /* Byte count should normally not be larger than a number of */
        /* times the uncompressed size plus some margin */
        if (bytecount > 1024 * 1024)
        {
            /* 10 and 4096 are just values that could be adjusted. */
            /* Hopefully they are safe enough for all codecs */
            tmsize_t stripsize = TIFFTileSize(tif);
            if (stripsize != 0 && (bytecount - 4096) / 10 > (uint64_t)stripsize)
            {
                uint64_t newbytecount = (uint64_t)stripsize * 10 + 4096;
                TIFFErrorExtR(tif, module,
                              "Too large tile byte count %" PRIu64
                              ", tile %" PRIu32 ". Limiting to %" PRIu64,
                              bytecount, tile, newbytecount);
                bytecount = newbytecount;
            }
        }

        if (isMapped(tif))
        {
            /*
             * We must check for overflow, potentially causing
             * an OOB read. Instead of simple
             *
             *  TIFFGetStrileOffset(tif, tile)+bytecount > tif->tif_size
             *
             * comparison (which can overflow) we do the following
             * two comparisons:
             */
            if (bytecount > (uint64_t)tif->tif_size ||
                TIFFGetStrileOffset(tif, tile) >
                    (uint64_t)tif->tif_size - bytecount)
            {
                tif->tif_curtile = NOTILE;
                return (0);
            }
        }

        if (isMapped(tif) && (isFillOrder(tif, td->td_fillorder) ||
                              (tif->tif_flags & TIFF_NOBITREV)))
        {
            /*
             * The image is mapped into memory and we either don't
             * need to flip bits or the compression routine is
             * going to handle this operation itself.  In this
             * case, avoid copying the raw data and instead just
             * reference the data from the memory mapped file
             * image.  This assumes that the decompression
             * routines do not modify the contents of the raw data
             * buffer (if they try to, the application will get a
             * fault since the file is mapped read-only).
             */
            if ((tif->tif_flags & TIFF_MYBUFFER) && tif->tif_rawdata)
            {
                _TIFFfreeExt(tif, tif->tif_rawdata);
                tif->tif_rawdata = NULL;
                tif->tif_rawdatasize = 0;
            }
            tif->tif_flags &= ~TIFF_MYBUFFER;

            tif->tif_rawdatasize = (tmsize_t)bytecount;
            tif->tif_rawdata =
                tif->tif_base + (tmsize_t)TIFFGetStrileOffset(tif, tile);
            tif->tif_rawdataoff = 0;
            tif->tif_rawdataloaded = (tmsize_t)bytecount;
            tif->tif_flags |= TIFF_BUFFERMMAP;
        }
        else
        {
            /*
             * Expand raw data buffer, if needed, to hold data
             * tile coming from file (perhaps should set upper
             * bound on the size of a buffer we'll use?).
             */
            tmsize_t bytecountm;
            bytecountm = (tmsize_t)bytecount;
            if ((uint64_t)bytecountm != bytecount)
            {
                TIFFErrorExtR(tif, module, "Integer overflow");
                return (0);
            }
            if (bytecountm > tif->tif_rawdatasize)
            {
                tif->tif_curtile = NOTILE;
                if ((tif->tif_flags & TIFF_MYBUFFER) == 0)
                {
                    TIFFErrorExtR(tif, module,
                                  "Data buffer too small to hold tile %" PRIu32,
                                  tile);
                    return (0);
                }
            }
            if (tif->tif_flags & TIFF_BUFFERMMAP)
            {
                tif->tif_curtile = NOTILE;
                tif->tif_rawdata = NULL;
                tif->tif_rawdatasize = 0;
                tif->tif_flags &= ~TIFF_BUFFERMMAP;
            }

            if (isMapped(tif))
            {
                if (bytecountm > tif->tif_rawdatasize &&
                    !TIFFReadBufferSetup(tif, 0, bytecountm))
                {
                    return (0);
                }
                if (TIFFReadRawTile1(tif, tile, tif->tif_rawdata, bytecountm,
                                     module) != bytecountm)
                {
                    return (0);
                }
            }
            else
            {
                if (TIFFReadRawStripOrTile2(tif, tile, 0, bytecountm, module) !=
                    bytecountm)
                {
                    return (0);
                }
            }

            tif->tif_rawdataoff = 0;
            tif->tif_rawdataloaded = bytecountm;

            if (tif->tif_rawdata != NULL &&
                !isFillOrder(tif, td->td_fillorder) &&
                (tif->tif_flags & TIFF_NOBITREV) == 0)
                TIFFReverseBits(tif->tif_rawdata, tif->tif_rawdataloaded);
        }
    }
    return (TIFFStartTile(tif, tile));
}